

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zone.cpp
# Opt level: O1

void __thiscall asmjit::ZoneHashBase::_rehash(ZoneHashBase *this,uint32_t newCount)

{
  uint uVar1;
  uint32_t newCount_00;
  ZoneHashNode **ppZVar2;
  ZoneHashNode *pZVar3;
  Zone *pZVar4;
  ZoneHashNode *pZVar5;
  ZoneHashNode **ppZVar6;
  uint32_t *puVar7;
  ZoneHeap *pZVar8;
  Slot *pSVar9;
  ulong uVar10;
  undefined4 in_register_00000034;
  ZoneHeap *this_00;
  size_t sStack_28;
  
  pZVar8 = (ZoneHeap *)CONCAT44(in_register_00000034,newCount);
  this_00 = this->_heap;
  if (this_00 == (ZoneHeap *)0x0) {
    _rehash();
LAB_00119df7:
    _rehash();
LAB_00119dfc:
    _rehash();
  }
  else {
    if (this_00->_zone == (Zone *)0x0) goto LAB_00119df7;
    ppZVar2 = this->_data;
    ppZVar6 = (ZoneHashNode **)ZoneHeap::_allocZeroed(this_00,(ulong)newCount << 3,&sStack_28);
    if (ppZVar6 == (ZoneHashNode **)0x0) {
      return;
    }
    this_00 = (ZoneHeap *)(ulong)this->_bucketsCount;
    if (this_00 != (ZoneHeap *)0x0) {
      pZVar8 = (ZoneHeap *)0x0;
      do {
        pZVar5 = ppZVar2[(long)pZVar8];
        while (pZVar5 != (ZoneHashNode *)0x0) {
          pZVar3 = *(ZoneHashNode **)pZVar5;
          *(ZoneHashNode **)pZVar5 = ppZVar6[(ulong)*(uint *)(pZVar5 + 8) % (ulong)newCount];
          ppZVar6[(ulong)*(uint *)(pZVar5 + 8) % (ulong)newCount] = pZVar5;
          pZVar5 = pZVar3;
        }
        pZVar8 = (ZoneHeap *)((long)&pZVar8->_zone + 1);
      } while (pZVar8 != this_00);
    }
    if (ppZVar2 == this->_embedded) {
LAB_00119da6:
      this->_bucketsCount = newCount;
      this->_bucketsGrow = (newCount * 9) / 10;
      this->_data = ppZVar6;
      return;
    }
    pZVar8 = this->_heap;
    if (pZVar8->_zone == (Zone *)0x0) goto LAB_00119dfc;
    if (ppZVar2 != (ZoneHashNode **)0x0) {
      if (this_00 != (ZoneHeap *)0x0) {
        _rehash();
        goto LAB_00119da6;
      }
      goto LAB_00119e06;
    }
  }
  _rehash();
LAB_00119e06:
  _rehash();
  uVar1 = *(uint *)(this_00->_slots + 1);
  uVar10 = (ulong)*(uint *)pZVar8->_slots % (ulong)uVar1;
  pSVar9 = this_00->_slots[2];
  pZVar4 = (Zone *)pSVar9[uVar10].next;
  pZVar8->_zone = pZVar4;
  pSVar9[uVar10].next = (Slot *)pZVar8;
  pSVar9 = (Slot *)((long)&this_00->_slots[0]->next + 1);
  this_00->_slots[0] = pSVar9;
  if (((Slot *)(ulong)*(uint *)((long)this_00->_slots + 0xc) <= pSVar9) && (pZVar4 != (Zone *)0x0))
  {
    puVar7 = &ZoneHash_getClosestPrime(unsigned_int)::primeTable;
    uVar10 = 0;
    do {
      newCount_00 = *puVar7;
      if (8 < uVar10) break;
      uVar10 = uVar10 + 1;
      puVar7 = puVar7 + 1;
    } while (newCount_00 <= uVar1);
    if (newCount_00 != uVar1) {
      _rehash((ZoneHashBase *)this_00,newCount_00);
    }
  }
  return;
}

Assistant:

void ZoneHashBase::_rehash(uint32_t newCount) noexcept {
  ASMJIT_ASSERT(isInitialized());

  ZoneHashNode** oldData = _data;
  ZoneHashNode** newData = reinterpret_cast<ZoneHashNode**>(
    _heap->allocZeroed(static_cast<size_t>(newCount) * sizeof(ZoneHashNode*)));

  // We can still store nodes into the table, but it will degrade.
  if (ASMJIT_UNLIKELY(newData == nullptr))
    return;

  uint32_t i;
  uint32_t oldCount = _bucketsCount;

  for (i = 0; i < oldCount; i++) {
    ZoneHashNode* node = oldData[i];
    while (node) {
      ZoneHashNode* next = node->_hashNext;
      uint32_t hMod = node->_hVal % newCount;

      node->_hashNext = newData[hMod];
      newData[hMod] = node;

      node = next;
    }
  }

  // 90% is the maximum occupancy, can't overflow since the maximum capacity
  // is limited to the last prime number stored in the prime table.
  if (oldData != _embedded)
    _heap->release(oldData, _bucketsCount * sizeof(ZoneHashNode*));

  _bucketsCount = newCount;
  _bucketsGrow = newCount * 9 / 10;

  _data = newData;
}